

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O3

RRStepType __thiscall
OSTEI_HRR_Algorithm_Base::GetKetRRStep(OSTEI_HRR_Algorithm_Base *this,DAM *dam)

{
  RRStepType RVar1;
  mapped_type *pmVar2;
  DAM DStack_38;
  
  DAM::notag(&DStack_38,dam);
  pmVar2 = std::
           map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
           ::at(&this->ketsteps_,&DStack_38);
  RVar1 = ((pmVar2->super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>)._M_impl.
           super__Vector_impl_data._M_start)->type;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)DStack_38.tag._M_dataplus._M_p != &DStack_38.tag.field_2) {
    operator_delete(DStack_38.tag._M_dataplus._M_p);
  }
  return RVar1;
}

Assistant:

RRStepType OSTEI_HRR_Algorithm_Base::GetKetRRStep(DAM dam) const
{
    return ketsteps_.at(dam.notag()).begin()->type;
}